

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1enc.c
# Opt level: O1

int jpc_enc_enccblk(jpc_enc_tcmpt_t *tcmpt,jpc_enc_band_t *band,jpc_enc_cblk_t *cblk)

{
  byte *pbVar1;
  jas_matrix_t *pjVar2;
  undefined8 uVar3;
  uint_fast16_t uVar4;
  uchar *puVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  jas_stream_t *pjVar14;
  jpc_mqenc_t *pjVar15;
  jpc_enc_pass_t *pjVar16;
  jas_matrix_t *pjVar17;
  jpc_bitstream_t *bitstream;
  long lVar18;
  ulong *puVar19;
  ulong uVar20;
  jpc_enc_pass_t *pjVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  jpc_enc_pass_t *pjVar25;
  jas_seqent_t *pjVar26;
  ulong uVar27;
  jas_seqent_t *pjVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  ulong *puVar33;
  jas_seqent_t *pjVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  jas_seqent_t *pjVar40;
  jas_seqent_t *pjVar41;
  char *pcVar42;
  long lVar43;
  long lVar44;
  jas_seqent_t *pjVar45;
  jpc_fix_t *pjVar46;
  int iVar47;
  ulong *puVar48;
  jas_seqent_t *pjVar49;
  uint uVar50;
  int iVar51;
  bool bVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  jas_seqent_t *local_140;
  ulong *local_138;
  jas_seqent_t *local_130;
  jas_seqent_t *local_128;
  int local_11c;
  jas_seqent_t *local_118;
  jpc_fix_t *local_110;
  jas_seqent_t *local_108;
  jas_seqent_t *local_100;
  jas_seqent_t *local_f8;
  jas_seqent_t *local_f0;
  uint local_e8;
  jas_seqent_t *local_e0;
  jpc_fix_t *local_d8;
  jas_seqent_t *local_d0;
  ulong *local_c8;
  ulong *local_b0;
  jas_seqent_t *local_a8;
  int local_a0;
  jas_seqent_t *local_98;
  jas_seqent_t *local_90;
  jas_seqent_t *local_88;
  jas_seqent_t *local_80;
  
  pjVar14 = jas_stream_memopen((char *)0x0,0);
  cblk->stream = pjVar14;
  if (pjVar14 == (jas_stream_t *)0x0) {
    __assert_fail("cblk->stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xd1,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  pjVar15 = jpc_mqenc_create(0x13,pjVar14);
  cblk->mqenc = pjVar15;
  if (pjVar15 == (jpc_mqenc_t *)0x0) {
    __assert_fail("cblk->mqenc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xd3,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  jpc_mqenc_setctxs(pjVar15,0x13,jpc_mqctxs);
  uVar13 = cblk->numbps * 3 - 2;
  if (cblk->numbps < 1) {
    uVar13 = 0;
  }
  cblk->numpasses = uVar13;
  if (uVar13 == 0) {
    cblk->passes = (jpc_enc_pass_t *)0x0;
  }
  else {
    pjVar16 = (jpc_enc_pass_t *)jas_alloc2((ulong)uVar13,0x48);
    cblk->passes = pjVar16;
    if (pjVar16 == (jpc_enc_pass_t *)0x0) {
      __assert_fail("cblk->passes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                    ,0xd9,
                    "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
    }
  }
  pjVar16 = cblk->passes;
  if (pjVar16 == (jpc_enc_pass_t *)0x0) {
    pjVar25 = (jpc_enc_pass_t *)0x0;
  }
  else {
    pjVar25 = pjVar16 + cblk->numpasses;
  }
  if (pjVar16 != pjVar25) {
    uVar13 = cblk->numpasses;
    local_e8 = (uint)tcmpt->cblksty >> 2 & 1;
    uVar24 = tcmpt->cblksty & 1;
    uVar31 = 0;
    do {
      *(undefined8 *)((long)&pjVar16->start + uVar31) = 0;
      iVar47 = (int)(uVar31 >> 3) * 0x38e38e39;
      iVar7 = JPC_ISTERMINATED(iVar47,0,uVar13,local_e8,uVar24);
      *(int *)((long)&pjVar16->term + uVar31) = iVar7;
      iVar47 = JPC_SEGTYPE(iVar47,0,uVar24);
      *(int *)((long)&pjVar16->type + uVar31) = iVar47;
      *(undefined4 *)((long)&pjVar16->lyrno + uVar31) = 0xffffffff;
      if ((jpc_enc_pass_t *)((long)&pjVar16->start + uVar31) == pjVar25 + -1) {
        if (iVar7 != 1) {
          __assert_fail("pass->term == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                        ,0xe5,
                        "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                       );
        }
        *(undefined4 *)((long)&pjVar16->term + uVar31) = 1;
      }
      pjVar21 = (jpc_enc_pass_t *)((long)&pjVar16[1].start + uVar31);
      uVar31 = uVar31 + 0x48;
    } while (pjVar21 != pjVar25);
  }
  pjVar17 = jas_matrix_create(cblk->data->numrows_ + 2,cblk->data->numcols_ + 2);
  cblk->flags = pjVar17;
  if (pjVar17 == (jas_matrix_t *)0x0) {
    __assert_fail("cblk->flags",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xec,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  if ((int)cblk->numpasses < 1) {
    bitstream = (jpc_bitstream_t *)0x0;
LAB_0012d193:
    pjVar16 = cblk->passes;
    if (pjVar16 == (jpc_enc_pass_t *)0x0) {
      pjVar25 = (jpc_enc_pass_t *)0x0;
    }
    else {
      pjVar25 = pjVar16 + cblk->numpasses;
    }
    if (pjVar16 != pjVar25) {
      iVar7 = 0;
      do {
        if (pjVar16->start < iVar7) {
          pjVar16->start = iVar7;
        }
        if (pjVar16->end < iVar7) {
          pjVar16->end = iVar7;
        }
        if (pjVar16->term == 0) {
          pjVar21 = pjVar16;
          if ((ulong)cblk->numpasses != 0) {
            lVar18 = 0x48;
            do {
              if (pjVar21->term != 0) break;
              pjVar21 = pjVar21 + 1;
              lVar44 = lVar18 >> 3;
              lVar18 = lVar18 + 0x48;
            } while (lVar44 * -0x71c71c71c71c71c7 < (long)(ulong)cblk->numpasses);
          }
          if (pjVar16->type == 1) {
            bVar52 = (pjVar16->mqencstate).lastbyte == 0xff;
            iVar47 = bVar52 + 5;
            if (4 < (pjVar16->mqencstate).ctreg) {
              iVar47 = bVar52 + 4;
            }
            pjVar16->end = pjVar16->end + iVar47;
          }
          if (pjVar21->end < pjVar16->end) {
            pjVar16->end = pjVar21->end;
          }
          pjVar14 = cblk->stream;
          lVar18 = jas_stream_tell(pjVar14);
          if (lVar18 < 0) {
            __assert_fail("oldpos >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                          ,0xb5,"int getthebyte(jas_stream_t *, long)");
          }
          jas_stream_seek(pjVar14,(long)pjVar16->end + -1,0);
          if (pjVar14->cnt_ < 1) {
            uVar13 = jas_stream_fillbuf(pjVar14,0);
          }
          else {
            uVar13 = (uint)*pjVar14->ptr_;
          }
          jas_stream_seek(pjVar14,lVar18,0);
          if (uVar13 == 0xff) {
            pjVar16->end = pjVar16->end + 1;
          }
          else if (uVar13 == 0xffffffff) {
            abort();
          }
        }
        if (iVar7 <= pjVar16->end) {
          iVar7 = pjVar16->end;
        }
        pjVar16 = pjVar16 + 1;
      } while (pjVar16 != pjVar25);
    }
    iVar7 = 0;
LAB_0012d2f4:
    if (bitstream != (jpc_bitstream_t *)0x0) {
      jpc_bitstream_close(bitstream);
    }
    return iVar7;
  }
  pjVar16 = cblk->passes;
  local_11c = cblk->numbps + -1;
  bitstream = (jpc_bitstream_t *)0x0;
  uVar13 = cblk->numpasses;
LAB_0012a35d:
  if (pjVar16->type != 1) {
    if (pjVar16->type != 2) {
      __assert_fail("pass->type == JPC_SEG_RAW",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                    ,0xf7,
                    "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
    }
    if ((bitstream == (jpc_bitstream_t *)0x0) &&
       (bitstream = jpc_bitstream_sopen(cblk->stream,"w"), bitstream == (jpc_bitstream_t *)0x0)) {
      return -1;
    }
  }
  pjVar25 = cblk->passes;
  lVar18 = jas_stream_tell(cblk->stream);
  pjVar16->start = (int)lVar18;
  if (local_11c < 0) {
    __assert_fail("bitpos >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0x108,
                  "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
  }
  lVar18 = (((long)pjVar16 - (long)pjVar25 >> 3) * -0x71c71c71c71c71c7 + 2) % 3;
  uVar24 = tcmpt->cblksty;
  uVar8 = uVar24 >> 3;
  iVar7 = pjVar16->term;
  iVar47 = ((uVar24 >> 4 & 1) != 0) + 1;
  if (iVar7 == 0) {
    iVar47 = 0;
  }
  iVar32 = (int)lVar18;
  bVar22 = (byte)local_11c;
  if (iVar32 == 2) {
    if (pjVar16->type != 1) {
      __assert_fail("pass->type == JPC_SEG_MQ",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                    ,0x121,
                    "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
    }
    pjVar15 = cblk->mqenc;
    pjVar17 = cblk->data;
    iVar32 = band->orient;
    pjVar2 = cblk->flags;
    pjVar16->nmsedec = 0;
    if (pjVar2->numrows_ < 2) {
      local_a8 = (jas_seqent_t *)0x0;
    }
    else {
      local_a8 = (jas_seqent_t *)((long)pjVar2->rows_[1] - (long)*pjVar2->rows_ >> 3);
    }
    iVar11 = (int)pjVar17->numcols_;
    uVar31 = pjVar17->numrows_;
    if ((long)uVar31 < 2) {
      local_a0 = 0;
    }
    else {
      local_a0 = (int)((long)pjVar17->rows_[1] - (long)*pjVar17->rows_ >> 3);
    }
    if (0 < (int)uVar31) {
      local_d8 = jpc_signmsedec;
      if (local_11c == 0) {
        local_d8 = jpc_signmsedec0;
      }
      local_c8 = (ulong *)*pjVar17->rows_;
      local_b0 = (ulong *)(pjVar2->rows_[1] + 1);
      iVar35 = (int)local_a8;
      lVar43 = (long)iVar35;
      uVar20 = (ulong)(0x40 << (bVar22 & 0x1f));
      lVar44 = (long)local_a0;
      uVar23 = iVar32 << 8;
      uVar27 = (ulong)local_a8 & 0xffffffff;
      do {
        uVar29 = (uint)uVar31;
        uVar36 = 4;
        if ((int)uVar29 < 4) {
          uVar36 = uVar29;
        }
        uVar37 = 1;
        if (1 < (int)uVar36) {
          uVar37 = uVar36;
        }
        puVar33 = local_b0;
        puVar48 = local_c8;
        iVar32 = iVar11;
        if (0 < iVar11) {
          do {
            local_138 = puVar48;
            puVar19 = puVar33;
            uVar50 = uVar36;
            if (((((int)uVar29 < 4) || ((*puVar33 & 0x50ff) != 0)) ||
                ((puVar33[lVar43] & 0x50ff) != 0)) ||
               (((puVar33[lVar43 * 2] & 0x50ff) != 0 || ((puVar33[lVar43 * 3] & 0x50ff) != 0)))) {
switchD_0012aeac_default:
              if ((*puVar19 & 0x5000) == 0) {
                pjVar15->curctx = pjVar15->ctxs + jpc_zcctxnolut[(uint)*puVar19 & 0xff | uVar23];
                uVar31 = *local_138;
                uVar30 = -uVar31;
                if (0 < (long)uVar31) {
                  uVar30 = uVar31;
                }
                jpc_mqenc_putbit(pjVar15,(uint)((uVar30 & uVar20) != 0));
                if ((uVar30 & uVar20) != 0) {
switchD_0012aeac_caseD_0:
                  uVar30 = *puVar19;
                  uVar31 = *local_138;
                  uVar39 = -uVar31;
                  if (0 < (long)uVar31) {
                    uVar39 = uVar31;
                  }
                  pjVar16->nmsedec =
                       pjVar16->nmsedec + local_d8[(uint)(uVar39 >> (bVar22 & 0x3f)) & 0x7f];
                  uVar9 = (uint)uVar30 >> 4 & 0xff;
                  pjVar15->curctx = pjVar15->ctxs + jpc_scctxnolut[uVar9];
                  uVar31 = *local_138;
                  jpc_mqenc_putbit(pjVar15,(uint)jpc_spblut[uVar9] ^ (uint)(uVar31 >> 0x3f));
                  if ((uVar8 & 1) == 0) {
                    *(byte *)(puVar19 + (-1 - uVar27)) = (byte)puVar19[-1 - uVar27] | 2;
                    *(byte *)(puVar19 + (1 - uVar27)) = (byte)puVar19[1 - uVar27] | 4;
                    *(byte *)(puVar19 + (uVar27 - 1)) = (byte)puVar19[uVar27 - 1] | 1;
                    *(byte *)(puVar19 + uVar27 + 1) = (byte)puVar19[uVar27 + 1] | 8;
                    if ((long)uVar31 < 0) {
                      puVar19[-uVar27] = puVar19[-uVar27] | 0x440;
                      uVar31 = puVar19[uVar27] | 0x110;
                      uVar30 = 0x880;
                      uVar39 = 0x220;
                    }
                    else {
                      puVar19[-uVar27] = puVar19[-uVar27] | 0x40;
                      uVar31 = puVar19[uVar27] | 0x10;
                      uVar30 = 0x80;
                      uVar39 = 0x20;
                    }
                  }
                  else {
                    *(byte *)(puVar19 + (uVar27 - 1)) = (byte)puVar19[uVar27 - 1] | 1;
                    *(byte *)(puVar19 + uVar27 + 1) = (byte)puVar19[uVar27 + 1] | 8;
                    if ((long)uVar31 < 0) {
                      uVar31 = puVar19[uVar27] | 0x110;
                      uVar30 = 0x880;
                      uVar39 = 0x220;
                    }
                    else {
                      uVar31 = puVar19[uVar27] | 0x10;
                      uVar30 = 0x80;
                      uVar39 = 0x20;
                    }
                  }
                  puVar19[uVar27] = uVar31;
                  puVar19[-1] = puVar19[-1] | uVar39;
                  puVar19[1] = puVar19[1] | uVar30;
                  *(byte *)((long)puVar19 + 1) = *(byte *)((long)puVar19 + 1) | 0x10;
                }
              }
              *(byte *)((long)puVar19 + 1) = *(byte *)((long)puVar19 + 1) & 0xbf;
              if (1 < (int)uVar50) {
                uVar50 = uVar50 - 1;
                puVar19 = puVar19 + lVar43;
                local_138 = local_138 + lVar44;
                if ((*puVar19 & 0x5000) == 0) {
                  pjVar15->curctx = pjVar15->ctxs + jpc_zcctxnolut[(uint)*puVar19 & 0xff | uVar23];
                  uVar31 = *local_138;
                  uVar30 = -uVar31;
                  if (0 < (long)uVar31) {
                    uVar30 = uVar31;
                  }
                  jpc_mqenc_putbit(pjVar15,(uint)((uVar30 & uVar20) != 0));
                  if ((uVar30 & uVar20) != 0) goto switchD_0012aeac_caseD_1;
                }
LAB_0012aaa9:
                *(byte *)((long)puVar19 + 1) = *(byte *)((long)puVar19 + 1) & 0xbf;
                if (1 < (int)uVar50) {
                  uVar50 = uVar50 - 1;
                  puVar19 = puVar19 + lVar43;
                  local_138 = local_138 + lVar44;
                  if ((*puVar19 & 0x5000) == 0) {
                    pjVar15->curctx = pjVar15->ctxs + jpc_zcctxnolut[(uint)*puVar19 & 0xff | uVar23]
                    ;
                    uVar31 = *local_138;
                    uVar30 = -uVar31;
                    if (0 < (long)uVar31) {
                      uVar30 = uVar31;
                    }
                    jpc_mqenc_putbit(pjVar15,(uint)((uVar30 & uVar20) != 0));
                    if ((uVar30 & uVar20) != 0) goto switchD_0012aeac_caseD_2;
                  }
LAB_0012ac19:
                  *(byte *)((long)puVar19 + 1) = *(byte *)((long)puVar19 + 1) & 0xbf;
                  if (1 < (int)uVar50) {
                    puVar19 = puVar19 + lVar43;
                    if ((*puVar19 & 0x5000) == 0) {
                      pjVar15->curctx =
                           pjVar15->ctxs + jpc_zcctxnolut[(uint)*puVar19 & 0xff | uVar23];
                      uVar31 = local_138[lVar44];
                      uVar30 = -uVar31;
                      if (0 < (long)uVar31) {
                        uVar30 = uVar31;
                      }
                      jpc_mqenc_putbit(pjVar15,(uint)((uVar30 & uVar20) != 0));
                      if ((uVar30 & uVar20) != 0) {
                        local_138 = local_138 + lVar44;
switchD_0012aeac_caseD_3:
                        uVar30 = *puVar19;
                        uVar31 = *local_138;
                        uVar39 = -uVar31;
                        if (0 < (long)uVar31) {
                          uVar39 = uVar31;
                        }
                        pjVar16->nmsedec =
                             pjVar16->nmsedec + local_d8[(uint)(uVar39 >> (bVar22 & 0x3f)) & 0x7f];
                        uVar50 = (uint)uVar30 >> 4 & 0xff;
                        pjVar15->curctx = pjVar15->ctxs + jpc_scctxnolut[uVar50];
                        uVar31 = *local_138;
                        jpc_mqenc_putbit(pjVar15,(uint)jpc_spblut[uVar50] ^ (uint)(uVar31 >> 0x3f));
                        *(byte *)(puVar19 + (-1 - uVar27)) = (byte)puVar19[-1 - uVar27] | 2;
                        *(byte *)(puVar19 + (1 - uVar27)) = (byte)puVar19[1 - uVar27] | 4;
                        *(byte *)(puVar19 + (uVar27 - 1)) = (byte)puVar19[uVar27 - 1] | 1;
                        *(byte *)(puVar19 + uVar27 + 1) = (byte)puVar19[uVar27 + 1] | 8;
                        if ((long)uVar31 < 0) {
                          uVar31 = 0x880;
                          uVar30 = 0x220;
                          uVar39 = 0x110;
                          uVar38 = 0x440;
                        }
                        else {
                          uVar31 = 0x80;
                          uVar30 = 0x20;
                          uVar39 = 0x10;
                          uVar38 = 0x40;
                        }
                        puVar19[-uVar27] = puVar19[-uVar27] | uVar38;
                        puVar19[uVar27] = puVar19[uVar27] | uVar39;
                        puVar19[-1] = puVar19[-1] | uVar30;
                        puVar19[1] = puVar19[1] | uVar31;
                        *(byte *)((long)puVar19 + 1) = *(byte *)((long)puVar19 + 1) | 0x10;
                      }
                    }
                    *(byte *)((long)puVar19 + 1) = *(byte *)((long)puVar19 + 1) & 0xbf;
                  }
                }
              }
            }
            else {
              uVar50 = 0;
              puVar19 = puVar48;
              do {
                uVar31 = *puVar19;
                uVar30 = -uVar31;
                if (0 < (long)uVar31) {
                  uVar30 = uVar31;
                }
                uVar9 = uVar50;
                if ((uVar20 & uVar30) != 0) break;
                uVar50 = uVar50 + 1;
                puVar19 = puVar19 + lVar44;
                uVar9 = uVar37;
              } while (uVar37 != uVar50);
              pjVar15->curctx = pjVar15->ctxs;
              if (uVar9 < 4) {
                jpc_mqenc_putbit(pjVar15,1);
                pjVar15->curctx = pjVar15->ctxs + 0x12;
                jpc_mqenc_putbit(pjVar15,uVar9 >> 1);
                jpc_mqenc_putbit(pjVar15,uVar9 & 1);
                puVar19 = puVar33 + (int)(uVar9 * iVar35);
                local_138 = puVar48 + (int)(uVar9 * local_a0);
                uVar50 = uVar36 - uVar9;
                switch(uVar9) {
                case 0:
                  goto switchD_0012aeac_caseD_0;
                case 1:
switchD_0012aeac_caseD_1:
                  uVar30 = *puVar19;
                  uVar31 = *local_138;
                  uVar39 = -uVar31;
                  if (0 < (long)uVar31) {
                    uVar39 = uVar31;
                  }
                  pjVar16->nmsedec =
                       pjVar16->nmsedec + local_d8[(uint)(uVar39 >> (bVar22 & 0x3f)) & 0x7f];
                  uVar9 = (uint)uVar30 >> 4 & 0xff;
                  pjVar15->curctx = pjVar15->ctxs + jpc_scctxnolut[uVar9];
                  uVar31 = *local_138;
                  jpc_mqenc_putbit(pjVar15,(uint)jpc_spblut[uVar9] ^ (uint)(uVar31 >> 0x3f));
                  *(byte *)(puVar19 + (-1 - uVar27)) = (byte)puVar19[-1 - uVar27] | 2;
                  *(byte *)(puVar19 + (1 - uVar27)) = (byte)puVar19[1 - uVar27] | 4;
                  *(byte *)(puVar19 + (uVar27 - 1)) = (byte)puVar19[uVar27 - 1] | 1;
                  *(byte *)(puVar19 + uVar27 + 1) = (byte)puVar19[uVar27 + 1] | 8;
                  if ((long)uVar31 < 0) {
                    uVar31 = 0x880;
                    uVar30 = 0x220;
                    uVar39 = 0x110;
                    uVar38 = 0x440;
                  }
                  else {
                    uVar31 = 0x80;
                    uVar30 = 0x20;
                    uVar39 = 0x10;
                    uVar38 = 0x40;
                  }
                  puVar19[-uVar27] = puVar19[-uVar27] | uVar38;
                  puVar19[uVar27] = puVar19[uVar27] | uVar39;
                  puVar19[-1] = puVar19[-1] | uVar30;
                  puVar19[1] = puVar19[1] | uVar31;
                  *(byte *)((long)puVar19 + 1) = *(byte *)((long)puVar19 + 1) | 0x10;
                  goto LAB_0012aaa9;
                case 2:
switchD_0012aeac_caseD_2:
                  uVar30 = *puVar19;
                  uVar31 = *local_138;
                  uVar39 = -uVar31;
                  if (0 < (long)uVar31) {
                    uVar39 = uVar31;
                  }
                  pjVar16->nmsedec =
                       pjVar16->nmsedec + local_d8[(uint)(uVar39 >> (bVar22 & 0x3f)) & 0x7f];
                  uVar9 = (uint)uVar30 >> 4 & 0xff;
                  pjVar15->curctx = pjVar15->ctxs + jpc_scctxnolut[uVar9];
                  uVar31 = *local_138;
                  jpc_mqenc_putbit(pjVar15,(uint)jpc_spblut[uVar9] ^ (uint)(uVar31 >> 0x3f));
                  *(byte *)(puVar19 + (-1 - uVar27)) = (byte)puVar19[-1 - uVar27] | 2;
                  *(byte *)(puVar19 + (1 - uVar27)) = (byte)puVar19[1 - uVar27] | 4;
                  *(byte *)(puVar19 + (uVar27 - 1)) = (byte)puVar19[uVar27 - 1] | 1;
                  *(byte *)(puVar19 + uVar27 + 1) = (byte)puVar19[uVar27 + 1] | 8;
                  if ((long)uVar31 < 0) {
                    uVar31 = 0x880;
                    uVar30 = 0x220;
                    uVar39 = 0x110;
                    uVar38 = 0x440;
                  }
                  else {
                    uVar31 = 0x80;
                    uVar30 = 0x20;
                    uVar39 = 0x10;
                    uVar38 = 0x40;
                  }
                  puVar19[-uVar27] = puVar19[-uVar27] | uVar38;
                  puVar19[uVar27] = puVar19[uVar27] | uVar39;
                  puVar19[-1] = puVar19[-1] | uVar30;
                  puVar19[1] = puVar19[1] | uVar31;
                  *(byte *)((long)puVar19 + 1) = *(byte *)((long)puVar19 + 1) | 0x10;
                  goto LAB_0012ac19;
                case 3:
                  goto switchD_0012aeac_caseD_3;
                default:
                  goto switchD_0012aeac_default;
                }
              }
              jpc_mqenc_putbit(pjVar15,0);
            }
            bVar52 = 1 < iVar32;
            puVar33 = puVar33 + 1;
            puVar48 = puVar48 + 1;
            iVar32 = iVar32 + -1;
          } while (bVar52);
        }
        local_b0 = local_b0 + iVar35 * 4;
        local_c8 = local_c8 + local_a0 * 4;
        uVar31 = (ulong)(uVar29 - 4);
      } while (4 < (int)uVar29);
    }
    if ((uVar24 & 0x20) != 0) {
      pjVar15->curctx = pjVar15->ctxs + 0x12;
      jpc_mqenc_putbit(pjVar15,1);
      jpc_mqenc_putbit(pjVar15,0);
      jpc_mqenc_putbit(pjVar15,1);
      jpc_mqenc_putbit(pjVar15,0);
    }
LAB_0012b341:
    if (iVar7 != 0) {
      jpc_mqenc_flush(pjVar15,iVar47 + -1);
    }
    iVar7 = pjVar15->err;
LAB_0012c261:
    iVar51 = -(uint)(iVar7 != 0);
  }
  else if (iVar32 == 1) {
    if (pjVar16->type == 1) {
      pjVar15 = cblk->mqenc;
      pjVar17 = cblk->data;
      pjVar2 = cblk->flags;
      pjVar16->nmsedec = 0;
      if (pjVar2->numrows_ < 2) {
        iVar32 = 0;
      }
      else {
        iVar32 = (int)((long)pjVar2->rows_[1] - (long)*pjVar2->rows_ >> 3);
      }
      iVar11 = (int)pjVar17->numcols_;
      uVar31 = pjVar17->numrows_;
      if ((long)uVar31 < 2) {
        iVar35 = 0;
      }
      else {
        iVar35 = (int)((long)pjVar17->rows_[1] - (long)*pjVar17->rows_ >> 3);
      }
      uVar24 = 0x40 << (bVar22 & 0x1f);
      if (0 < (int)uVar31) {
        local_110 = jpc_refnmsedec;
        if (local_11c == 0) {
          local_110 = jpc_refnmsedec0;
        }
        local_128 = *pjVar17->rows_;
        pjVar26 = pjVar2->rows_[1];
        pjVar34 = pjVar26 + 1;
        lVar44 = (long)iVar32;
        iVar32 = iVar32 << 2;
        lVar43 = (long)iVar35;
        iVar35 = iVar35 << 2;
        local_f8 = local_128 + lVar43;
        local_130 = local_128 + lVar43 * 2;
        local_108 = local_128 + lVar43 * 3;
        pjVar28 = pjVar26 + lVar44 + 1;
        local_118 = pjVar26 + lVar44 * 2 + 1;
        local_100 = pjVar26 + lVar44 * 3 + 1;
        do {
          iVar10 = (int)uVar31;
          if (0 < iVar11) {
            lVar44 = 0;
            iVar51 = iVar11 + 1;
            do {
              if ((*(uint *)((long)pjVar34 + lVar44) & 0x5000) == 0x1000) {
                uVar8 = *(uint *)((long)local_128 + lVar44);
                uVar23 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar23 = uVar8;
                }
                pjVar16->nmsedec = pjVar16->nmsedec + local_110[uVar23 >> (bVar22 & 0x3f) & 0x7f];
                pjVar15->curctx =
                     pjVar15->ctxs +
                     jpc_magctxnolut
                     [(ulong)((uint)(*(ulong *)((long)pjVar34 + lVar44) >> 2) & 0x800) |
                      *(ulong *)((long)pjVar34 + lVar44) & 0xff];
                jpc_mqenc_putbit(pjVar15,(uint)((uVar24 & uVar23) != 0));
                pbVar1 = (byte *)((long)pjVar34 + lVar44 + 1);
                *pbVar1 = *pbVar1 | 0x20;
              }
              if (iVar10 != 1) {
                if ((*(uint *)((long)pjVar28 + lVar44) & 0x5000) == 0x1000) {
                  uVar8 = *(uint *)((long)local_f8 + lVar44);
                  uVar23 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar23 = uVar8;
                  }
                  pjVar16->nmsedec = pjVar16->nmsedec + local_110[uVar23 >> (bVar22 & 0x3f) & 0x7f];
                  pjVar15->curctx =
                       pjVar15->ctxs +
                       jpc_magctxnolut
                       [(ulong)((uint)(*(ulong *)((long)pjVar28 + lVar44) >> 2) & 0x800) |
                        *(ulong *)((long)pjVar28 + lVar44) & 0xff];
                  jpc_mqenc_putbit(pjVar15,(uint)((uVar24 & uVar23) != 0));
                  pbVar1 = (byte *)((long)pjVar28 + lVar44 + 1);
                  *pbVar1 = *pbVar1 | 0x20;
                }
                if (2 < iVar10) {
                  if ((*(uint *)((long)local_118 + lVar44) & 0x5000) == 0x1000) {
                    uVar8 = *(uint *)((long)local_130 + lVar44);
                    uVar23 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar23 = uVar8;
                    }
                    pjVar16->nmsedec =
                         pjVar16->nmsedec + local_110[uVar23 >> (bVar22 & 0x3f) & 0x7f];
                    pjVar15->curctx =
                         pjVar15->ctxs +
                         jpc_magctxnolut
                         [(ulong)((uint)(*(ulong *)((long)local_118 + lVar44) >> 2) & 0x800) |
                          *(ulong *)((long)local_118 + lVar44) & 0xff];
                    jpc_mqenc_putbit(pjVar15,(uint)((uVar24 & uVar23) != 0));
                    pbVar1 = (byte *)((long)local_118 + lVar44 + 1);
                    *pbVar1 = *pbVar1 | 0x20;
                  }
                  if ((iVar10 != 3) && ((*(uint *)((long)local_100 + lVar44) & 0x5000) == 0x1000)) {
                    uVar8 = *(uint *)((long)local_108 + lVar44);
                    uVar23 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar23 = uVar8;
                    }
                    pjVar16->nmsedec =
                         pjVar16->nmsedec + local_110[uVar23 >> (bVar22 & 0x3f) & 0x7f];
                    pjVar15->curctx =
                         pjVar15->ctxs +
                         jpc_magctxnolut
                         [(ulong)((uint)(*(ulong *)((long)local_100 + lVar44) >> 2) & 0x800) |
                          *(ulong *)((long)local_100 + lVar44) & 0xff];
                    jpc_mqenc_putbit(pjVar15,(uint)((uVar24 & uVar23) != 0));
                    pbVar1 = (byte *)((long)local_100 + lVar44 + 1);
                    *pbVar1 = *pbVar1 | 0x20;
                  }
                }
              }
              iVar51 = iVar51 + -1;
              lVar44 = lVar44 + 8;
            } while (1 < iVar51);
          }
          local_128 = local_128 + iVar35;
          local_f8 = local_f8 + iVar35;
          local_130 = local_130 + iVar35;
          local_108 = local_108 + iVar35;
          pjVar34 = pjVar34 + iVar32;
          pjVar28 = pjVar28 + iVar32;
          local_118 = local_118 + iVar32;
          local_100 = local_100 + iVar32;
          uVar31 = (ulong)(iVar10 - 4);
        } while (4 < iVar10);
      }
      goto LAB_0012b341;
    }
    pjVar17 = cblk->data;
    pjVar2 = cblk->flags;
    pjVar16->nmsedec = 0;
    if (pjVar2->numrows_ < 2) {
      iVar47 = 0;
    }
    else {
      iVar47 = (int)((long)pjVar2->rows_[1] - (long)*pjVar2->rows_ >> 3);
    }
    iVar32 = (int)pjVar17->numcols_;
    uVar31 = pjVar17->numrows_;
    if ((long)uVar31 < 2) {
      iVar11 = 0;
    }
    else {
      iVar11 = (int)((long)pjVar17->rows_[1] - (long)*pjVar17->rows_ >> 3);
    }
    if (0 < (int)uVar31) {
      pjVar46 = jpc_refnmsedec;
      if (local_11c == 0) {
        pjVar46 = jpc_refnmsedec0;
      }
      pjVar26 = *pjVar17->rows_;
      local_118 = pjVar2->rows_[1];
      pjVar34 = local_118 + 1;
      uVar20 = (ulong)(0x40 << (bVar22 & 0x1f));
      lVar44 = (long)iVar47;
      iVar47 = iVar47 << 2;
      lVar43 = (long)iVar11;
      iVar11 = iVar11 << 2;
      pjVar28 = local_118 + lVar44 + 1;
      local_138 = (ulong *)(local_118 + lVar44 * 2 + 1);
      local_118 = local_118 + lVar44 * 3 + 1;
      local_128 = pjVar26 + lVar43;
      local_f8 = pjVar26 + lVar43 * 2;
      local_f0 = pjVar26 + lVar43 * 3;
      do {
        iVar35 = (int)uVar31;
        if (0 < iVar32) {
          lVar44 = 0;
          iVar10 = iVar32 + 1;
          do {
            if ((*(uint *)((long)pjVar34 + lVar44) & 0x5000) == 0x1000) {
              uVar31 = *(ulong *)((long)pjVar26 + lVar44);
              uVar27 = -uVar31;
              if (0 < (long)uVar31) {
                uVar27 = uVar31;
              }
              pjVar16->nmsedec =
                   pjVar16->nmsedec + pjVar46[(uint)(uVar27 >> (bVar22 & 0x3f)) & 0x7f];
              if ((bitstream->openmode_ & 2) == 0) {
                __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                              ,0x301,
                              "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                             );
              }
              iVar12 = bitstream->cnt_;
              iVar51 = iVar12 + -1;
              bitstream->cnt_ = iVar51;
              uVar24 = (uint)((uVar27 & uVar20) != 0);
              if (iVar12 < 1) {
                uVar31 = bitstream->buf_;
                pjVar14 = bitstream->stream_;
                uVar27 = uVar31 & 0xff;
                uVar8 = uVar27 == 0xff ^ 7;
                bitstream->cnt_ = uVar8;
                bitstream->buf_ = (ulong)(uVar24 << (sbyte)uVar8) | uVar27 << 8;
                uVar24 = pjVar14->flags_;
                iVar51 = -1;
                if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                goto LAB_0012d185;
                *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                iVar12 = pjVar14->cnt_;
                pjVar14->cnt_ = iVar12 + -1;
                bVar6 = (byte)uVar31;
                if (iVar12 < 1) {
                  iVar12 = jas_stream_flushbuf(pjVar14,(uint)bVar6);
                  if (iVar12 == -1) goto LAB_0012c26e;
                }
                else {
                  pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                  pbVar1 = pjVar14->ptr_;
                  pjVar14->ptr_ = pbVar1 + 1;
                  *pbVar1 = bVar6;
                }
              }
              else {
                bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar24 << ((byte)iVar51 & 0x1f));
              }
              pbVar1 = (byte *)((long)pjVar34 + lVar44 + 1);
              *pbVar1 = *pbVar1 | 0x20;
            }
            if (iVar35 != 1) {
              if ((*(uint *)((long)pjVar28 + lVar44) & 0x5000) == 0x1000) {
                uVar31 = *(ulong *)((long)local_128 + lVar44);
                uVar27 = -uVar31;
                if (0 < (long)uVar31) {
                  uVar27 = uVar31;
                }
                pjVar16->nmsedec =
                     pjVar16->nmsedec + pjVar46[(uint)(uVar27 >> (bVar22 & 0x3f)) & 0x7f];
                if ((bitstream->openmode_ & 2) == 0) {
                  __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                ,0x308,
                                "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                               );
                }
                iVar12 = bitstream->cnt_;
                iVar51 = iVar12 + -1;
                bitstream->cnt_ = iVar51;
                uVar24 = (uint)((uVar27 & uVar20) != 0);
                if (iVar12 < 1) {
                  uVar31 = bitstream->buf_;
                  pjVar14 = bitstream->stream_;
                  uVar27 = uVar31 & 0xff;
                  uVar8 = uVar27 == 0xff ^ 7;
                  bitstream->cnt_ = uVar8;
                  bitstream->buf_ = (ulong)(uVar24 << (sbyte)uVar8) | uVar27 << 8;
                  uVar24 = pjVar14->flags_;
                  iVar51 = -1;
                  if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                  if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                  goto LAB_0012d185;
                  *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                  iVar12 = pjVar14->cnt_;
                  pjVar14->cnt_ = iVar12 + -1;
                  bVar6 = (byte)uVar31;
                  if (iVar12 < 1) {
                    iVar12 = jas_stream_flushbuf(pjVar14,(uint)bVar6);
                    if (iVar12 == -1) goto LAB_0012c26e;
                  }
                  else {
                    pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                    pbVar1 = pjVar14->ptr_;
                    pjVar14->ptr_ = pbVar1 + 1;
                    *pbVar1 = bVar6;
                  }
                }
                else {
                  bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar24 << ((byte)iVar51 & 0x1f));
                }
                pbVar1 = (byte *)((long)pjVar28 + lVar44 + 1);
                *pbVar1 = *pbVar1 | 0x20;
              }
              if (2 < iVar35) {
                if ((*(uint *)((long)local_138 + lVar44) & 0x5000) == 0x1000) {
                  uVar31 = *(ulong *)((long)local_f8 + lVar44);
                  uVar27 = -uVar31;
                  if (0 < (long)uVar31) {
                    uVar27 = uVar31;
                  }
                  pjVar16->nmsedec =
                       pjVar16->nmsedec + pjVar46[(uint)(uVar27 >> (bVar22 & 0x3f)) & 0x7f];
                  if ((bitstream->openmode_ & 2) == 0) {
                    __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0x30f,
                                  "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                 );
                  }
                  iVar12 = bitstream->cnt_;
                  iVar51 = iVar12 + -1;
                  bitstream->cnt_ = iVar51;
                  uVar24 = (uint)((uVar27 & uVar20) != 0);
                  if (iVar12 < 1) {
                    uVar31 = bitstream->buf_;
                    pjVar14 = bitstream->stream_;
                    uVar27 = uVar31 & 0xff;
                    uVar8 = uVar27 == 0xff ^ 7;
                    bitstream->cnt_ = uVar8;
                    bitstream->buf_ = (ulong)(uVar24 << (sbyte)uVar8) | uVar27 << 8;
                    uVar24 = pjVar14->flags_;
                    iVar51 = -1;
                    if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                    if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                    goto LAB_0012d185;
                    *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                    iVar12 = pjVar14->cnt_;
                    pjVar14->cnt_ = iVar12 + -1;
                    bVar6 = (byte)uVar31;
                    if (iVar12 < 1) {
                      iVar12 = jas_stream_flushbuf(pjVar14,(uint)bVar6);
                      if (iVar12 == -1) goto LAB_0012c26e;
                    }
                    else {
                      pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                      pbVar1 = pjVar14->ptr_;
                      pjVar14->ptr_ = pbVar1 + 1;
                      *pbVar1 = bVar6;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar24 << ((byte)iVar51 & 0x1f))
                    ;
                  }
                  pbVar1 = (byte *)((long)local_138 + lVar44 + 1);
                  *pbVar1 = *pbVar1 | 0x20;
                }
                if ((iVar35 != 3) && ((*(uint *)((long)local_118 + lVar44) & 0x5000) == 0x1000)) {
                  uVar31 = *(ulong *)((long)local_f0 + lVar44);
                  uVar27 = -uVar31;
                  if (0 < (long)uVar31) {
                    uVar27 = uVar31;
                  }
                  pjVar16->nmsedec =
                       pjVar16->nmsedec + pjVar46[(uint)(uVar27 >> (bVar22 & 0x3f)) & 0x7f];
                  if ((bitstream->openmode_ & 2) == 0) {
                    __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0x316,
                                  "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                 );
                  }
                  iVar12 = bitstream->cnt_;
                  iVar51 = iVar12 + -1;
                  bitstream->cnt_ = iVar51;
                  uVar24 = (uint)((uVar27 & uVar20) != 0);
                  if (iVar12 < 1) {
                    uVar31 = bitstream->buf_;
                    pjVar14 = bitstream->stream_;
                    uVar27 = uVar31 & 0xff;
                    uVar8 = uVar27 == 0xff ^ 7;
                    bitstream->cnt_ = uVar8;
                    bitstream->buf_ = (ulong)(uVar24 << (sbyte)uVar8) | uVar27 << 8;
                    uVar24 = pjVar14->flags_;
                    iVar51 = -1;
                    if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                    if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                    goto LAB_0012d185;
                    *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                    iVar12 = pjVar14->cnt_;
                    pjVar14->cnt_ = iVar12 + -1;
                    bVar6 = (byte)uVar31;
                    if (iVar12 < 1) {
                      iVar12 = jas_stream_flushbuf(pjVar14,(uint)bVar6);
                      if (iVar12 == -1) goto LAB_0012c26e;
                    }
                    else {
                      pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                      pbVar1 = pjVar14->ptr_;
                      pjVar14->ptr_ = pbVar1 + 1;
                      *pbVar1 = bVar6;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar24 << ((byte)iVar51 & 0x1f))
                    ;
                  }
                  pbVar1 = (byte *)((long)local_118 + lVar44 + 1);
                  *pbVar1 = *pbVar1 | 0x20;
                }
              }
            }
            iVar10 = iVar10 + -1;
            lVar44 = lVar44 + 8;
          } while (1 < iVar10);
        }
        pjVar34 = pjVar34 + iVar47;
        pjVar28 = pjVar28 + iVar47;
        local_138 = local_138 + iVar47;
        local_118 = local_118 + iVar47;
        pjVar26 = pjVar26 + iVar11;
        local_128 = local_128 + iVar11;
        local_f8 = local_f8 + iVar11;
        local_f0 = local_f0 + iVar11;
        uVar31 = (ulong)(iVar35 - 4);
      } while (4 < iVar35);
    }
    iVar51 = 0;
    if (iVar7 != 0) {
      jpc_bitstream_outalign(bitstream,0x2a);
      iVar51 = 0;
    }
  }
  else {
    if (iVar32 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                    ,0x127,
                    "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
    }
    if (pjVar16->type == 1) {
      pjVar15 = cblk->mqenc;
      pjVar17 = cblk->data;
      iVar32 = band->orient;
      pjVar2 = cblk->flags;
      pjVar16->nmsedec = 0;
      if (pjVar2->numrows_ < 2) {
        uVar31 = 0;
      }
      else {
        uVar31 = (long)pjVar2->rows_[1] - (long)*pjVar2->rows_ >> 3;
      }
      iVar11 = (int)pjVar17->numcols_;
      local_138 = (ulong *)pjVar17->numrows_;
      if ((long)local_138 < 2) {
        iVar35 = 0;
      }
      else {
        iVar35 = (int)((long)pjVar17->rows_[1] - (long)*pjVar17->rows_ >> 3);
      }
      if (0 < (int)local_138) {
        local_100 = jpc_signmsedec;
        if (local_11c == 0) {
          local_100 = jpc_signmsedec0;
        }
        pjVar26 = pjVar2->rows_[1];
        uVar20 = uVar31 & 0xffffffff;
        lVar44 = (long)(int)uVar31;
        pjVar34 = pjVar26 + 2;
        local_80 = pjVar34 + -uVar20;
        local_140 = pjVar26 + lVar44 + 2;
        local_f0 = pjVar26 + lVar44 * 2 + 2;
        local_c8 = (ulong *)(pjVar26 + lVar44 * 3 + 2);
        local_e0 = pjVar26 + uVar20 + 2;
        local_d8 = pjVar26 + lVar44 + uVar20 + 2;
        local_d0 = pjVar26 + ((lVar44 + 2) - uVar20);
        local_88 = pjVar26 + uVar20 + lVar44 * 2 + 2;
        local_90 = pjVar26 + ((lVar44 * 2 + 2) - uVar20);
        local_a8 = pjVar26 + uVar20 + lVar44 * 3 + 2;
        pjVar26 = pjVar26 + ((lVar44 * 3 + 2) - uVar20);
        local_f8 = *pjVar17->rows_;
        iVar10 = (int)uVar31 * 4;
        uVar31 = (ulong)(0x40 << (bVar22 & 0x1f));
        uVar24 = iVar32 << 8;
        lVar44 = (long)iVar35;
        iVar35 = iVar35 << 2;
        local_108 = local_f8 + lVar44;
        local_b0 = (ulong *)(local_f8 + lVar44 * 2);
        local_98 = local_f8 + lVar44 * 3;
        do {
          if (0 < iVar11) {
            lVar44 = 0;
            iVar32 = iVar11 + 1;
            do {
              uVar20 = *(ulong *)((long)pjVar34 + lVar44 + -8);
              if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                uVar27 = *(ulong *)((long)local_f8 + lVar44);
                uVar30 = -uVar27;
                if (0 < (long)uVar27) {
                  uVar30 = uVar27;
                }
                pjVar15->curctx = pjVar15->ctxs + jpc_zcctxnolut[(uint)uVar20 & 0xff | uVar24];
                jpc_mqenc_putbit(pjVar15,(uint)((uVar30 & uVar31) != 0));
                if ((uVar30 & uVar31) != 0) {
                  uVar27 = *(ulong *)((long)local_f8 + lVar44);
                  uVar30 = -uVar27;
                  if (0 < (long)uVar27) {
                    uVar30 = uVar27;
                  }
                  pjVar16->nmsedec =
                       pjVar16->nmsedec + local_100[(uint)(uVar30 >> (bVar22 & 0x3f)) & 0x7f];
                  lVar43 = *(long *)((long)local_f8 + lVar44);
                  uVar23 = (uint)uVar20 >> 4 & 0xff;
                  pjVar15->curctx = pjVar15->ctxs + jpc_scctxnolut[uVar23];
                  jpc_mqenc_putbit(pjVar15,(uint)jpc_spblut[uVar23] ^ (uint)((ulong)lVar43 >> 0x3f))
                  ;
                  if ((uVar8 & 1) == 0) {
                    pbVar1 = (byte *)((long)local_80 + lVar44 + -0x10);
                    *pbVar1 = *pbVar1 | 2;
                    *(byte *)((long)local_80 + lVar44) = *(byte *)((long)local_80 + lVar44) | 4;
                    pbVar1 = (byte *)((long)local_e0 + lVar44 + -0x10);
                    *pbVar1 = *pbVar1 | 1;
                    *(byte *)((long)local_e0 + lVar44) = *(byte *)((long)local_e0 + lVar44) | 8;
                    uVar20 = *(ulong *)((long)local_80 + lVar44 + -8);
                    if (-1 < lVar43) {
                      *(ulong *)((long)local_80 + lVar44 + -8) = uVar20 | 0x40;
                      uVar20 = *(ulong *)((long)local_e0 + lVar44 + -8);
                      goto LAB_0012bce5;
                    }
                    *(ulong *)((long)local_80 + lVar44 + -8) = uVar20 | 0x440;
                    uVar20 = *(ulong *)((long)local_e0 + lVar44 + -8);
LAB_0012bd15:
                    uVar20 = uVar20 | 0x110;
                    uVar27 = 0x880;
                    uVar30 = 0x220;
                  }
                  else {
                    pbVar1 = (byte *)((long)local_e0 + lVar44 + -0x10);
                    *pbVar1 = *pbVar1 | 1;
                    *(byte *)((long)local_e0 + lVar44) = *(byte *)((long)local_e0 + lVar44) | 8;
                    uVar20 = *(ulong *)((long)local_e0 + lVar44 + -8);
                    if (lVar43 < 0) goto LAB_0012bd15;
LAB_0012bce5:
                    uVar20 = uVar20 | 0x10;
                    uVar27 = 0x80;
                    uVar30 = 0x20;
                  }
                  *(ulong *)((long)local_e0 + lVar44 + -8) = uVar20;
                  puVar33 = (ulong *)((long)pjVar34 + lVar44 + -0x10);
                  *puVar33 = *puVar33 | uVar30;
                  *(ulong *)((long)pjVar34 + lVar44) = *(ulong *)((long)pjVar34 + lVar44) | uVar27;
                  pbVar1 = (byte *)((long)pjVar34 + lVar44 + -7);
                  *pbVar1 = *pbVar1 | 0x10;
                }
                pbVar1 = (byte *)((long)pjVar34 + lVar44 + -7);
                *pbVar1 = *pbVar1 | 0x40;
              }
              if ((int)local_138 != 1) {
                uVar20 = *(ulong *)((long)local_140 + lVar44 + -8);
                if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                  uVar27 = *(ulong *)((long)local_108 + lVar44);
                  uVar30 = -uVar27;
                  if (0 < (long)uVar27) {
                    uVar30 = uVar27;
                  }
                  pjVar15->curctx = pjVar15->ctxs + jpc_zcctxnolut[(uint)uVar20 & 0xff | uVar24];
                  jpc_mqenc_putbit(pjVar15,(uint)((uVar30 & uVar31) != 0));
                  if ((uVar30 & uVar31) != 0) {
                    uVar27 = *(ulong *)((long)local_108 + lVar44);
                    uVar30 = -uVar27;
                    if (0 < (long)uVar27) {
                      uVar30 = uVar27;
                    }
                    pjVar16->nmsedec =
                         pjVar16->nmsedec + local_100[(uint)(uVar30 >> (bVar22 & 0x3f)) & 0x7f];
                    lVar43 = *(long *)((long)local_108 + lVar44);
                    uVar23 = (uint)uVar20 >> 4 & 0xff;
                    pjVar15->curctx = pjVar15->ctxs + jpc_scctxnolut[uVar23];
                    jpc_mqenc_putbit(pjVar15,(uint)jpc_spblut[uVar23] ^
                                             (uint)((ulong)lVar43 >> 0x3f));
                    pbVar1 = (byte *)((long)local_d0 + lVar44 + -0x10);
                    *pbVar1 = *pbVar1 | 2;
                    *(byte *)((long)local_d0 + lVar44) = *(byte *)((long)local_d0 + lVar44) | 4;
                    pbVar1 = (byte *)((long)local_d8 + lVar44 + -0x10);
                    *pbVar1 = *pbVar1 | 1;
                    *(byte *)((long)local_d8 + lVar44) = *(byte *)((long)local_d8 + lVar44) | 8;
                    if (lVar43 < 0) {
                      uVar20 = 0x880;
                      uVar27 = 0x220;
                      uVar30 = 0x110;
                      uVar39 = 0x440;
                    }
                    else {
                      uVar20 = 0x80;
                      uVar27 = 0x20;
                      uVar30 = 0x10;
                      uVar39 = 0x40;
                    }
                    puVar33 = (ulong *)((long)local_d0 + lVar44 + -8);
                    *puVar33 = *puVar33 | uVar39;
                    puVar33 = (ulong *)((long)local_d8 + lVar44 + -8);
                    *puVar33 = *puVar33 | uVar30;
                    puVar33 = (ulong *)((long)local_140 + lVar44 + -0x10);
                    *puVar33 = *puVar33 | uVar27;
                    *(ulong *)((long)local_140 + lVar44) =
                         *(ulong *)((long)local_140 + lVar44) | uVar20;
                    pbVar1 = (byte *)((long)local_140 + lVar44 + -7);
                    *pbVar1 = *pbVar1 | 0x10;
                  }
                  pbVar1 = (byte *)((long)local_140 + lVar44 + -7);
                  *pbVar1 = *pbVar1 | 0x40;
                }
                if (2 < (int)local_138) {
                  uVar20 = *(ulong *)((long)local_f0 + lVar44 + -8);
                  if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                    uVar27 = *(ulong *)((long)local_b0 + lVar44);
                    uVar30 = -uVar27;
                    if (0 < (long)uVar27) {
                      uVar30 = uVar27;
                    }
                    pjVar15->curctx = pjVar15->ctxs + jpc_zcctxnolut[(uint)uVar20 & 0xff | uVar24];
                    jpc_mqenc_putbit(pjVar15,(uint)((uVar30 & uVar31) != 0));
                    if ((uVar30 & uVar31) != 0) {
                      uVar27 = *(ulong *)((long)local_b0 + lVar44);
                      uVar30 = -uVar27;
                      if (0 < (long)uVar27) {
                        uVar30 = uVar27;
                      }
                      pjVar16->nmsedec =
                           pjVar16->nmsedec + local_100[(uint)(uVar30 >> (bVar22 & 0x3f)) & 0x7f];
                      lVar43 = *(long *)((long)local_b0 + lVar44);
                      uVar23 = (uint)uVar20 >> 4 & 0xff;
                      pjVar15->curctx = pjVar15->ctxs + jpc_scctxnolut[uVar23];
                      jpc_mqenc_putbit(pjVar15,(uint)jpc_spblut[uVar23] ^
                                               (uint)((ulong)lVar43 >> 0x3f));
                      pbVar1 = (byte *)((long)local_90 + lVar44 + -0x10);
                      *pbVar1 = *pbVar1 | 2;
                      *(byte *)((long)local_90 + lVar44) = *(byte *)((long)local_90 + lVar44) | 4;
                      pbVar1 = (byte *)((long)local_88 + lVar44 + -0x10);
                      *pbVar1 = *pbVar1 | 1;
                      *(byte *)((long)local_88 + lVar44) = *(byte *)((long)local_88 + lVar44) | 8;
                      if (lVar43 < 0) {
                        uVar20 = 0x880;
                        uVar27 = 0x220;
                        uVar30 = 0x110;
                        uVar39 = 0x440;
                      }
                      else {
                        uVar20 = 0x80;
                        uVar27 = 0x20;
                        uVar30 = 0x10;
                        uVar39 = 0x40;
                      }
                      puVar33 = (ulong *)((long)local_90 + lVar44 + -8);
                      *puVar33 = *puVar33 | uVar39;
                      puVar33 = (ulong *)((long)local_88 + lVar44 + -8);
                      *puVar33 = *puVar33 | uVar30;
                      puVar33 = (ulong *)((long)local_f0 + lVar44 + -0x10);
                      *puVar33 = *puVar33 | uVar27;
                      *(ulong *)((long)local_f0 + lVar44) =
                           *(ulong *)((long)local_f0 + lVar44) | uVar20;
                      pbVar1 = (byte *)((long)local_f0 + lVar44 + -7);
                      *pbVar1 = *pbVar1 | 0x10;
                    }
                    pbVar1 = (byte *)((long)local_f0 + lVar44 + -7);
                    *pbVar1 = *pbVar1 | 0x40;
                  }
                  if ((int)local_138 != 3) {
                    uVar20 = *(ulong *)((long)local_c8 + lVar44 + -8);
                    if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                      uVar27 = *(ulong *)((long)local_98 + lVar44);
                      uVar30 = -uVar27;
                      if (0 < (long)uVar27) {
                        uVar30 = uVar27;
                      }
                      pjVar15->curctx = pjVar15->ctxs + jpc_zcctxnolut[(uint)uVar20 & 0xff | uVar24]
                      ;
                      jpc_mqenc_putbit(pjVar15,(uint)((uVar30 & uVar31) != 0));
                      if ((uVar30 & uVar31) != 0) {
                        uVar27 = *(ulong *)((long)local_98 + lVar44);
                        uVar30 = -uVar27;
                        if (0 < (long)uVar27) {
                          uVar30 = uVar27;
                        }
                        pjVar16->nmsedec =
                             pjVar16->nmsedec + local_100[(uint)(uVar30 >> (bVar22 & 0x3f)) & 0x7f];
                        lVar43 = *(long *)((long)local_98 + lVar44);
                        uVar23 = (uint)uVar20 >> 4 & 0xff;
                        pjVar15->curctx = pjVar15->ctxs + jpc_scctxnolut[uVar23];
                        jpc_mqenc_putbit(pjVar15,(uint)jpc_spblut[uVar23] ^
                                                 (uint)((ulong)lVar43 >> 0x3f));
                        pbVar1 = (byte *)((long)pjVar26 + lVar44 + -0x10);
                        *pbVar1 = *pbVar1 | 2;
                        *(byte *)((long)pjVar26 + lVar44) = *(byte *)((long)pjVar26 + lVar44) | 4;
                        pbVar1 = (byte *)((long)local_a8 + lVar44 + -0x10);
                        *pbVar1 = *pbVar1 | 1;
                        *(byte *)((long)local_a8 + lVar44) = *(byte *)((long)local_a8 + lVar44) | 8;
                        if (lVar43 < 0) {
                          uVar20 = 0x880;
                          uVar27 = 0x220;
                          uVar30 = 0x110;
                          uVar39 = 0x440;
                        }
                        else {
                          uVar20 = 0x80;
                          uVar27 = 0x20;
                          uVar30 = 0x10;
                          uVar39 = 0x40;
                        }
                        puVar33 = (ulong *)((long)pjVar26 + lVar44 + -8);
                        *puVar33 = *puVar33 | uVar39;
                        puVar33 = (ulong *)((long)local_a8 + lVar44 + -8);
                        *puVar33 = *puVar33 | uVar30;
                        puVar33 = (ulong *)((long)local_c8 + lVar44 + -0x10);
                        *puVar33 = *puVar33 | uVar27;
                        *(ulong *)((long)local_c8 + lVar44) =
                             *(ulong *)((long)local_c8 + lVar44) | uVar20;
                        pbVar1 = (byte *)((long)local_c8 + lVar44 + -7);
                        *pbVar1 = *pbVar1 | 0x10;
                      }
                      pbVar1 = (byte *)((long)local_c8 + lVar44 + -7);
                      *pbVar1 = *pbVar1 | 0x40;
                    }
                  }
                }
              }
              iVar32 = iVar32 + -1;
              lVar44 = lVar44 + 8;
            } while (1 < iVar32);
          }
          local_f8 = local_f8 + iVar35;
          local_108 = local_108 + iVar35;
          local_b0 = local_b0 + iVar35;
          local_98 = local_98 + iVar35;
          pjVar34 = pjVar34 + iVar10;
          local_e0 = local_e0 + iVar10;
          local_80 = local_80 + iVar10;
          local_140 = local_140 + iVar10;
          local_d8 = local_d8 + iVar10;
          local_d0 = local_d0 + iVar10;
          local_f0 = local_f0 + iVar10;
          local_88 = local_88 + iVar10;
          local_90 = local_90 + iVar10;
          local_c8 = local_c8 + iVar10;
          local_a8 = local_a8 + iVar10;
          pjVar26 = pjVar26 + iVar10;
          bVar52 = 4 < (int)local_138;
          local_138 = (ulong *)(ulong)((int)local_138 - 4);
        } while (bVar52);
      }
      if (iVar7 != 0) {
        jpc_mqenc_flush(pjVar15,iVar47 + -1);
      }
      iVar7 = pjVar15->err;
      goto LAB_0012c261;
    }
    pjVar17 = cblk->data;
    pjVar2 = cblk->flags;
    pjVar16->nmsedec = 0;
    if (pjVar2->numrows_ < 2) {
      uVar31 = 0;
    }
    else {
      uVar31 = (long)pjVar2->rows_[1] - (long)*pjVar2->rows_ >> 3;
    }
    iVar47 = (int)pjVar17->numcols_;
    uVar20 = pjVar17->numrows_;
    if ((long)uVar20 < 2) {
      iVar32 = 0;
    }
    else {
      iVar32 = (int)((long)pjVar17->rows_[1] - (long)*pjVar17->rows_ >> 3);
    }
    if (0 < (int)uVar20) {
      pjVar46 = jpc_signmsedec;
      if (local_11c == 0) {
        pjVar46 = jpc_signmsedec0;
      }
      local_98 = pjVar2->rows_[1];
      uVar27 = uVar31 & 0xffffffff;
      lVar44 = (long)(int)uVar31;
      pjVar34 = local_98 + 2;
      local_d8 = pjVar34 + -uVar27;
      pjVar49 = local_98 + lVar44 + 2;
      local_118 = local_98 + lVar44 * 2 + 2;
      local_f0 = local_98 + lVar44 * 3 + 2;
      pjVar41 = local_98 + uVar27 + 2;
      local_d0 = local_98 + lVar44 + uVar27 + 2;
      local_c8 = (ulong *)(local_98 + ((lVar44 + 2) - uVar27));
      local_80 = local_98 + uVar27 + lVar44 * 2 + 2;
      local_88 = local_98 + ((lVar44 * 2 + 2) - uVar27);
      local_90 = local_98 + uVar27 + lVar44 * 3 + 2;
      local_98 = local_98 + ((lVar44 * 3 + 2) - uVar27);
      pjVar26 = *pjVar17->rows_;
      iVar11 = (int)uVar31 * 4;
      uVar31 = (ulong)(0x40 << (bVar22 & 0x1f));
      lVar44 = (long)iVar32;
      iVar32 = iVar32 << 2;
      pjVar40 = pjVar26 + lVar44;
      pjVar28 = pjVar26 + lVar44 * 2;
      pjVar45 = pjVar26 + lVar44 * 3;
      do {
        iVar35 = (int)uVar20;
        if (0 < iVar47) {
          lVar44 = 0;
          iVar10 = iVar47 + 1;
          do {
            uVar20 = *(ulong *)((long)pjVar34 + lVar44 + -8);
            if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
              uVar20 = *(ulong *)((long)pjVar26 + lVar44);
              uVar27 = -uVar20;
              if (0 < (long)uVar20) {
                uVar27 = uVar20;
              }
              if ((bitstream->openmode_ & 2) == 0) {
                pcVar42 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012d389:
                __assert_fail(pcVar42,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                              ,0x23e,
                              "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                             );
              }
              iVar12 = bitstream->cnt_;
              iVar51 = iVar12 + -1;
              bitstream->cnt_ = iVar51;
              uVar24 = (uint)((uVar31 & uVar27) != 0);
              if (iVar12 < 1) {
                uVar20 = bitstream->buf_;
                pjVar14 = bitstream->stream_;
                uVar30 = uVar20 & 0xff;
                uVar23 = uVar30 == 0xff ^ 7;
                bitstream->cnt_ = uVar23;
                bitstream->buf_ = (ulong)(uVar24 << (sbyte)uVar23) | uVar30 << 8;
                uVar24 = pjVar14->flags_;
                iVar51 = -1;
                if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                goto LAB_0012d185;
                *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                iVar12 = pjVar14->cnt_;
                pjVar14->cnt_ = iVar12 + -1;
                bVar6 = (byte)uVar20;
                if (iVar12 < 1) {
                  iVar12 = jas_stream_flushbuf(pjVar14,(uint)bVar6);
                  if (iVar12 == -1) goto LAB_0012c26e;
                }
                else {
                  pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                  pbVar1 = pjVar14->ptr_;
                  pjVar14->ptr_ = pbVar1 + 1;
                  *pbVar1 = bVar6;
                }
              }
              else {
                bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar24 << ((byte)iVar51 & 0x1f));
              }
              if ((uVar31 & uVar27) != 0) {
                uVar20 = *(ulong *)((long)pjVar26 + lVar44);
                uVar27 = -uVar20;
                if (0 < (long)uVar20) {
                  uVar27 = uVar20;
                }
                pjVar16->nmsedec =
                     pjVar16->nmsedec + pjVar46[(uint)(uVar27 >> (bVar22 & 0x3f)) & 0x7f];
                if ((bitstream->openmode_ & 2) == 0) {
                  pcVar42 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                  goto LAB_0012d389;
                }
                lVar43 = *(long *)((long)pjVar26 + lVar44);
                iVar12 = bitstream->cnt_;
                iVar51 = iVar12 + -1;
                bitstream->cnt_ = iVar51;
                uVar23 = (uint)((ulong)lVar43 >> 0x3f);
                if (iVar12 < 1) {
                  uVar4 = bitstream->buf_;
                  pjVar14 = bitstream->stream_;
                  uVar24 = (uint)uVar4 & 0xff;
                  uVar36 = uVar24 << 8;
                  uVar24 = uVar24 == 0xff ^ 7;
                  bitstream->cnt_ = uVar24;
                  uVar23 = uVar23 << (sbyte)uVar24;
                  bitstream->buf_ = (ulong)(uVar23 | uVar36);
                  uVar24 = pjVar14->flags_;
                  iVar51 = -1;
                  if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                  if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                  goto LAB_0012d185;
                  *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                  iVar12 = pjVar14->cnt_;
                  pjVar14->cnt_ = iVar12 + -1;
                  if (iVar12 < 1) {
                    iVar12 = jas_stream_flushbuf(pjVar14,(uVar23 & 0xff00 | uVar36) >> 8);
                    if (iVar12 == -1) goto LAB_0012c26e;
                  }
                  else {
                    pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                    puVar5 = pjVar14->ptr_;
                    pjVar14->ptr_ = puVar5 + 1;
                    *puVar5 = (uchar)uVar4;
                  }
                }
                else {
                  bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar23 << ((byte)iVar51 & 0x1f));
                }
                if ((uVar8 & 1) == 0) {
                  pbVar1 = (byte *)((long)local_d8 + lVar44 + -0x10);
                  *pbVar1 = *pbVar1 | 2;
                  *(byte *)((long)local_d8 + lVar44) = *(byte *)((long)local_d8 + lVar44) | 4;
                  pbVar1 = (byte *)((long)pjVar41 + lVar44 + -0x10);
                  *pbVar1 = *pbVar1 | 1;
                  *(byte *)((long)pjVar41 + lVar44) = *(byte *)((long)pjVar41 + lVar44) | 8;
                  uVar20 = *(ulong *)((long)local_d8 + lVar44 + -8);
                  if (-1 < lVar43) {
                    *(ulong *)((long)local_d8 + lVar44 + -8) = uVar20 | 0x40;
                    uVar20 = *(ulong *)((long)pjVar41 + lVar44 + -8);
                    goto LAB_0012c850;
                  }
                  *(ulong *)((long)local_d8 + lVar44 + -8) = uVar20 | 0x440;
                  uVar20 = *(ulong *)((long)pjVar41 + lVar44 + -8);
LAB_0012c880:
                  uVar20 = uVar20 | 0x110;
                  uVar27 = 0x880;
                  uVar30 = 0x220;
                }
                else {
                  pbVar1 = (byte *)((long)pjVar41 + lVar44 + -0x10);
                  *pbVar1 = *pbVar1 | 1;
                  *(byte *)((long)pjVar41 + lVar44) = *(byte *)((long)pjVar41 + lVar44) | 8;
                  uVar20 = *(ulong *)((long)pjVar41 + lVar44 + -8);
                  if (lVar43 < 0) goto LAB_0012c880;
LAB_0012c850:
                  uVar20 = uVar20 | 0x10;
                  uVar27 = 0x80;
                  uVar30 = 0x20;
                }
                *(ulong *)((long)pjVar41 + lVar44 + -8) = uVar20;
                puVar33 = (ulong *)((long)pjVar34 + lVar44 + -0x10);
                *puVar33 = *puVar33 | uVar30;
                *(ulong *)((long)pjVar34 + lVar44) = *(ulong *)((long)pjVar34 + lVar44) | uVar27;
                pbVar1 = (byte *)((long)pjVar34 + lVar44 + -7);
                *pbVar1 = *pbVar1 | 0x10;
              }
              pbVar1 = (byte *)((long)pjVar34 + lVar44 + -7);
              *pbVar1 = *pbVar1 | 0x40;
            }
            if (iVar35 != 1) {
              uVar20 = *(ulong *)((long)pjVar49 + lVar44 + -8);
              if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                uVar20 = *(ulong *)((long)pjVar40 + lVar44);
                uVar27 = -uVar20;
                if (0 < (long)uVar20) {
                  uVar27 = uVar20;
                }
                if ((bitstream->openmode_ & 2) == 0) {
                  pcVar42 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012d42d:
                  __assert_fail(pcVar42,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                ,0x246,
                                "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                               );
                }
                iVar12 = bitstream->cnt_;
                iVar51 = iVar12 + -1;
                bitstream->cnt_ = iVar51;
                uVar24 = (uint)((uVar31 & uVar27) != 0);
                if (iVar12 < 1) {
                  uVar20 = bitstream->buf_;
                  pjVar14 = bitstream->stream_;
                  uVar30 = uVar20 & 0xff;
                  uVar23 = uVar30 == 0xff ^ 7;
                  bitstream->cnt_ = uVar23;
                  bitstream->buf_ = (ulong)(uVar24 << (sbyte)uVar23) | uVar30 << 8;
                  uVar24 = pjVar14->flags_;
                  iVar51 = -1;
                  if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                  if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                  goto LAB_0012d185;
                  *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                  iVar12 = pjVar14->cnt_;
                  pjVar14->cnt_ = iVar12 + -1;
                  bVar6 = (byte)uVar20;
                  if (iVar12 < 1) {
                    iVar12 = jas_stream_flushbuf(pjVar14,(uint)bVar6);
                    if (iVar12 == -1) goto LAB_0012c26e;
                  }
                  else {
                    pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                    pbVar1 = pjVar14->ptr_;
                    pjVar14->ptr_ = pbVar1 + 1;
                    *pbVar1 = bVar6;
                  }
                }
                else {
                  bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar24 << ((byte)iVar51 & 0x1f));
                }
                if ((uVar31 & uVar27) != 0) {
                  uVar20 = *(ulong *)((long)pjVar40 + lVar44);
                  uVar27 = -uVar20;
                  if (0 < (long)uVar20) {
                    uVar27 = uVar20;
                  }
                  pjVar16->nmsedec =
                       pjVar16->nmsedec + pjVar46[(uint)(uVar27 >> (bVar22 & 0x3f)) & 0x7f];
                  if ((bitstream->openmode_ & 2) == 0) {
                    pcVar42 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                    goto LAB_0012d42d;
                  }
                  uVar3 = *(undefined8 *)((long)pjVar40 + lVar44);
                  iVar12 = bitstream->cnt_;
                  iVar51 = iVar12 + -1;
                  bitstream->cnt_ = iVar51;
                  uVar23 = (uint)((ulong)uVar3 >> 0x20);
                  uVar36 = uVar23 >> 0x1f;
                  if (iVar12 < 1) {
                    uVar4 = bitstream->buf_;
                    pjVar14 = bitstream->stream_;
                    uVar24 = (uint)uVar4 & 0xff;
                    uVar37 = uVar24 << 8;
                    uVar24 = uVar24 == 0xff ^ 7;
                    bitstream->cnt_ = uVar24;
                    uVar29 = uVar36 << (sbyte)uVar24;
                    bitstream->buf_ = (ulong)(uVar29 | uVar37);
                    uVar24 = pjVar14->flags_;
                    iVar51 = -1;
                    if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                    if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                    goto LAB_0012d185;
                    *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                    iVar12 = pjVar14->cnt_;
                    pjVar14->cnt_ = iVar12 + -1;
                    if (iVar12 < 1) {
                      iVar12 = jas_stream_flushbuf(pjVar14,(uVar29 & 0xff00 | uVar37) >> 8);
                      if (iVar12 == -1) goto LAB_0012c26e;
                    }
                    else {
                      pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                      puVar5 = pjVar14->ptr_;
                      pjVar14->ptr_ = puVar5 + 1;
                      *puVar5 = (uchar)uVar4;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar36 << ((byte)iVar51 & 0x1f))
                    ;
                  }
                  pbVar1 = (byte *)((long)local_c8 + lVar44 + -0x10);
                  *pbVar1 = *pbVar1 | 2;
                  *(byte *)((long)local_c8 + lVar44) = *(byte *)((long)local_c8 + lVar44) | 4;
                  pbVar1 = (byte *)((long)local_d0 + lVar44 + -0x10);
                  *pbVar1 = *pbVar1 | 1;
                  *(byte *)((long)local_d0 + lVar44) = *(byte *)((long)local_d0 + lVar44) | 8;
                  uVar23 = uVar23 >> 0x1f;
                  *(ulong *)((long)local_c8 + lVar44 + -8) =
                       (ulong)(uVar23 << 10) | *(ulong *)((long)local_c8 + lVar44 + -8) | 0x40;
                  *(ulong *)((long)local_d0 + lVar44 + -8) =
                       (ulong)(uVar23 << 8) | *(ulong *)((long)local_d0 + lVar44 + -8) | 0x10;
                  *(ulong *)((long)pjVar49 + lVar44 + -0x10) =
                       (ulong)(uVar23 << 9) | *(ulong *)((long)pjVar49 + lVar44 + -0x10) | 0x20;
                  *(ulong *)((long)pjVar49 + lVar44) =
                       (ulong)(uVar36 << 0xb) | *(ulong *)((long)pjVar49 + lVar44) | 0x80;
                  pbVar1 = (byte *)((long)pjVar49 + lVar44 + -7);
                  *pbVar1 = *pbVar1 | 0x10;
                }
                pbVar1 = (byte *)((long)pjVar49 + lVar44 + -7);
                *pbVar1 = *pbVar1 | 0x40;
              }
              if (2 < iVar35) {
                uVar20 = *(ulong *)((long)local_118 + lVar44 + -8);
                if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                  uVar20 = *(ulong *)((long)pjVar28 + lVar44);
                  uVar27 = -uVar20;
                  if (0 < (long)uVar20) {
                    uVar27 = uVar20;
                  }
                  if ((bitstream->openmode_ & 2) == 0) {
                    pcVar42 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012d4b7:
                    __assert_fail(pcVar42,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0x24e,
                                  "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                 );
                  }
                  iVar12 = bitstream->cnt_;
                  iVar51 = iVar12 + -1;
                  bitstream->cnt_ = iVar51;
                  uVar24 = (uint)((uVar31 & uVar27) != 0);
                  if (iVar12 < 1) {
                    uVar20 = bitstream->buf_;
                    pjVar14 = bitstream->stream_;
                    uVar30 = uVar20 & 0xff;
                    uVar23 = uVar30 == 0xff ^ 7;
                    bitstream->cnt_ = uVar23;
                    bitstream->buf_ = (ulong)(uVar24 << (sbyte)uVar23) | uVar30 << 8;
                    uVar24 = pjVar14->flags_;
                    iVar51 = -1;
                    if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                    if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                    goto LAB_0012d185;
                    *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                    iVar12 = pjVar14->cnt_;
                    pjVar14->cnt_ = iVar12 + -1;
                    bVar6 = (byte)uVar20;
                    if (iVar12 < 1) {
                      iVar12 = jas_stream_flushbuf(pjVar14,(uint)bVar6);
                      if (iVar12 == -1) goto LAB_0012c26e;
                    }
                    else {
                      pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                      pbVar1 = pjVar14->ptr_;
                      pjVar14->ptr_ = pbVar1 + 1;
                      *pbVar1 = bVar6;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar24 << ((byte)iVar51 & 0x1f))
                    ;
                  }
                  if ((uVar31 & uVar27) != 0) {
                    uVar20 = *(ulong *)((long)pjVar28 + lVar44);
                    uVar27 = -uVar20;
                    if (0 < (long)uVar20) {
                      uVar27 = uVar20;
                    }
                    pjVar16->nmsedec =
                         pjVar16->nmsedec + pjVar46[(uint)(uVar27 >> (bVar22 & 0x3f)) & 0x7f];
                    if ((bitstream->openmode_ & 2) == 0) {
                      pcVar42 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                      goto LAB_0012d4b7;
                    }
                    uVar3 = *(undefined8 *)((long)pjVar28 + lVar44);
                    iVar12 = bitstream->cnt_;
                    iVar51 = iVar12 + -1;
                    bitstream->cnt_ = iVar51;
                    uVar23 = (uint)((ulong)uVar3 >> 0x20);
                    uVar36 = uVar23 >> 0x1f;
                    if (iVar12 < 1) {
                      uVar4 = bitstream->buf_;
                      pjVar14 = bitstream->stream_;
                      uVar24 = (uint)uVar4 & 0xff;
                      uVar37 = uVar24 << 8;
                      uVar24 = uVar24 == 0xff ^ 7;
                      bitstream->cnt_ = uVar24;
                      uVar29 = uVar36 << (sbyte)uVar24;
                      bitstream->buf_ = (ulong)(uVar29 | uVar37);
                      uVar24 = pjVar14->flags_;
                      iVar51 = -1;
                      if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                      if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                      goto LAB_0012d185;
                      *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                      iVar12 = pjVar14->cnt_;
                      pjVar14->cnt_ = iVar12 + -1;
                      if (iVar12 < 1) {
                        iVar12 = jas_stream_flushbuf(pjVar14,(uVar29 & 0xff00 | uVar37) >> 8);
                        if (iVar12 == -1) goto LAB_0012c26e;
                      }
                      else {
                        pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                        puVar5 = pjVar14->ptr_;
                        pjVar14->ptr_ = puVar5 + 1;
                        *puVar5 = (uchar)uVar4;
                      }
                    }
                    else {
                      bitstream->buf_ =
                           bitstream->buf_ | (long)(int)(uVar36 << ((byte)iVar51 & 0x1f));
                    }
                    pbVar1 = (byte *)((long)local_88 + lVar44 + -0x10);
                    *pbVar1 = *pbVar1 | 2;
                    *(byte *)((long)local_88 + lVar44) = *(byte *)((long)local_88 + lVar44) | 4;
                    pbVar1 = (byte *)((long)local_80 + lVar44 + -0x10);
                    *pbVar1 = *pbVar1 | 1;
                    *(byte *)((long)local_80 + lVar44) = *(byte *)((long)local_80 + lVar44) | 8;
                    uVar23 = uVar23 >> 0x1f;
                    *(ulong *)((long)local_88 + lVar44 + -8) =
                         (ulong)(uVar23 << 10) | *(ulong *)((long)local_88 + lVar44 + -8) | 0x40;
                    *(ulong *)((long)local_80 + lVar44 + -8) =
                         (ulong)(uVar23 << 8) | *(ulong *)((long)local_80 + lVar44 + -8) | 0x10;
                    *(ulong *)((long)local_118 + lVar44 + -0x10) =
                         (ulong)(uVar23 << 9) | *(ulong *)((long)local_118 + lVar44 + -0x10) | 0x20;
                    *(ulong *)((long)local_118 + lVar44) =
                         (ulong)(uVar36 << 0xb) | *(ulong *)((long)local_118 + lVar44) | 0x80;
                    pbVar1 = (byte *)((long)local_118 + lVar44 + -7);
                    *pbVar1 = *pbVar1 | 0x10;
                  }
                  pbVar1 = (byte *)((long)local_118 + lVar44 + -7);
                  *pbVar1 = *pbVar1 | 0x40;
                }
                if ((iVar35 != 3) &&
                   (uVar20 = *(ulong *)((long)local_f0 + lVar44 + -8),
                   (uVar20 & 0x5000) == 0 && (char)uVar20 != '\0')) {
                  uVar20 = *(ulong *)((long)pjVar45 + lVar44);
                  uVar27 = -uVar20;
                  if (0 < (long)uVar20) {
                    uVar27 = uVar20;
                  }
                  if ((bitstream->openmode_ & 2) == 0) {
                    pcVar42 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012d53c:
                    __assert_fail(pcVar42,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0x256,
                                  "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                 );
                  }
                  iVar12 = bitstream->cnt_;
                  iVar51 = iVar12 + -1;
                  bitstream->cnt_ = iVar51;
                  uVar24 = (uint)((uVar31 & uVar27) != 0);
                  if (iVar12 < 1) {
                    uVar20 = bitstream->buf_;
                    pjVar14 = bitstream->stream_;
                    uVar30 = uVar20 & 0xff;
                    uVar23 = uVar30 == 0xff ^ 7;
                    bitstream->cnt_ = uVar23;
                    bitstream->buf_ = (ulong)(uVar24 << (sbyte)uVar23) | uVar30 << 8;
                    uVar24 = pjVar14->flags_;
                    iVar51 = -1;
                    if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                    if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                    goto LAB_0012d185;
                    *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                    iVar12 = pjVar14->cnt_;
                    pjVar14->cnt_ = iVar12 + -1;
                    bVar6 = (byte)uVar20;
                    if (iVar12 < 1) {
                      iVar12 = jas_stream_flushbuf(pjVar14,(uint)bVar6);
                      if (iVar12 == -1) goto LAB_0012c26e;
                    }
                    else {
                      pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                      pbVar1 = pjVar14->ptr_;
                      pjVar14->ptr_ = pbVar1 + 1;
                      *pbVar1 = bVar6;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar24 << ((byte)iVar51 & 0x1f))
                    ;
                  }
                  if ((uVar31 & uVar27) != 0) {
                    uVar20 = *(ulong *)((long)pjVar45 + lVar44);
                    uVar27 = -uVar20;
                    if (0 < (long)uVar20) {
                      uVar27 = uVar20;
                    }
                    pjVar16->nmsedec =
                         pjVar16->nmsedec + pjVar46[(uint)(uVar27 >> (bVar22 & 0x3f)) & 0x7f];
                    if ((bitstream->openmode_ & 2) == 0) {
                      pcVar42 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                      goto LAB_0012d53c;
                    }
                    uVar3 = *(undefined8 *)((long)pjVar45 + lVar44);
                    iVar12 = bitstream->cnt_;
                    iVar51 = iVar12 + -1;
                    bitstream->cnt_ = iVar51;
                    uVar23 = (uint)((ulong)uVar3 >> 0x20);
                    uVar36 = uVar23 >> 0x1f;
                    if (iVar12 < 1) {
                      uVar4 = bitstream->buf_;
                      pjVar14 = bitstream->stream_;
                      uVar24 = (uint)uVar4 & 0xff;
                      uVar37 = uVar24 << 8;
                      uVar24 = uVar24 == 0xff ^ 7;
                      bitstream->cnt_ = uVar24;
                      uVar29 = uVar36 << (sbyte)uVar24;
                      bitstream->buf_ = (ulong)(uVar29 | uVar37);
                      uVar24 = pjVar14->flags_;
                      iVar51 = -1;
                      if ((uVar24 & 7) != 0) goto LAB_0012c26e;
                      if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
                      goto LAB_0012d185;
                      *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                      iVar12 = pjVar14->cnt_;
                      pjVar14->cnt_ = iVar12 + -1;
                      if (iVar12 < 1) {
                        iVar12 = jas_stream_flushbuf(pjVar14,(uVar29 & 0xff00 | uVar37) >> 8);
                        if (iVar12 == -1) goto LAB_0012c26e;
                      }
                      else {
                        pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                        puVar5 = pjVar14->ptr_;
                        pjVar14->ptr_ = puVar5 + 1;
                        *puVar5 = (uchar)uVar4;
                      }
                    }
                    else {
                      bitstream->buf_ =
                           bitstream->buf_ | (long)(int)(uVar36 << ((byte)iVar51 & 0x1f));
                    }
                    pbVar1 = (byte *)((long)local_98 + lVar44 + -0x10);
                    *pbVar1 = *pbVar1 | 2;
                    *(byte *)((long)local_98 + lVar44) = *(byte *)((long)local_98 + lVar44) | 4;
                    pbVar1 = (byte *)((long)local_90 + lVar44 + -0x10);
                    *pbVar1 = *pbVar1 | 1;
                    *(byte *)((long)local_90 + lVar44) = *(byte *)((long)local_90 + lVar44) | 8;
                    uVar23 = uVar23 >> 0x1f;
                    *(ulong *)((long)local_98 + lVar44 + -8) =
                         (ulong)(uVar23 << 10) | *(ulong *)((long)local_98 + lVar44 + -8) | 0x40;
                    *(ulong *)((long)local_90 + lVar44 + -8) =
                         (ulong)(uVar23 << 8) | *(ulong *)((long)local_90 + lVar44 + -8) | 0x10;
                    *(ulong *)((long)local_f0 + lVar44 + -0x10) =
                         (ulong)(uVar23 << 9) | *(ulong *)((long)local_f0 + lVar44 + -0x10) | 0x20;
                    *(ulong *)((long)local_f0 + lVar44) =
                         (ulong)(uVar36 << 0xb) | *(ulong *)((long)local_f0 + lVar44) | 0x80;
                    pbVar1 = (byte *)((long)local_f0 + lVar44 + -7);
                    *pbVar1 = *pbVar1 | 0x10;
                  }
                  pbVar1 = (byte *)((long)local_f0 + lVar44 + -7);
                  *pbVar1 = *pbVar1 | 0x40;
                }
              }
            }
            iVar10 = iVar10 + -1;
            lVar44 = lVar44 + 8;
          } while (1 < iVar10);
        }
        pjVar26 = pjVar26 + iVar32;
        pjVar40 = pjVar40 + iVar32;
        pjVar28 = pjVar28 + iVar32;
        pjVar45 = pjVar45 + iVar32;
        pjVar34 = pjVar34 + iVar11;
        pjVar41 = pjVar41 + iVar11;
        local_d8 = local_d8 + iVar11;
        pjVar49 = pjVar49 + iVar11;
        local_d0 = local_d0 + iVar11;
        local_c8 = local_c8 + iVar11;
        local_118 = local_118 + iVar11;
        local_80 = local_80 + iVar11;
        local_88 = local_88 + iVar11;
        local_f0 = local_f0 + iVar11;
        local_90 = local_90 + iVar11;
        local_98 = local_98 + iVar11;
        uVar20 = (ulong)(iVar35 - 4);
      } while (4 < iVar35);
    }
    iVar51 = 0;
    if (iVar7 != 0) {
      jpc_bitstream_outalign(bitstream,0x2a);
      iVar51 = 0;
    }
  }
  goto LAB_0012c26e;
LAB_0012d185:
  pjVar14->flags_ = uVar24 | 4;
  iVar51 = -1;
LAB_0012c26e:
  if (iVar51 != 0) {
    iVar7 = -1;
    goto LAB_0012d2f4;
  }
  if (pjVar16->type == 1) {
    if (pjVar16->term != 0) {
      jpc_mqenc_init(cblk->mqenc);
    }
    jpc_mqenc_getstate(cblk->mqenc,&pjVar16->mqencstate);
    lVar44 = jas_stream_tell(cblk->stream);
    pjVar16->end = (int)lVar44;
    if ((tcmpt->cblksty & 2) != 0) {
      jpc_mqenc_setctxs(cblk->mqenc,0x13,jpc_mqctxs);
    }
  }
  else if (pjVar16->term == 0) {
    lVar44 = jas_stream_tell(cblk->stream);
    iVar7 = jpc_bitstream_pending(bitstream);
    pjVar16->end = (int)lVar44 + iVar7;
  }
  else {
    iVar7 = jpc_bitstream_pending(bitstream);
    if (iVar7 != 0) {
      jpc_bitstream_outalign(bitstream,0x2a);
    }
    jpc_bitstream_close(bitstream);
    lVar44 = jas_stream_tell(cblk->stream);
    pjVar16->end = (int)lVar44;
    bitstream = (jpc_bitstream_t *)0x0;
  }
  dVar53 = (double)band->rlvl->tcmpt->synweight * 0.0001220703125;
  dVar54 = (double)band->synweight * 0.0001220703125;
  dVar55 = (double)band->absstepsize * 0.0001220703125;
  dVar56 = (double)(1 << (bVar22 & 0x1f));
  dVar53 = (double)pjVar16->nmsedec * 0.0001220703125 *
           dVar53 * dVar53 * dVar54 * dVar54 * dVar55 * dVar55 * dVar56 * dVar56;
  pjVar16->wmsedec = dVar53;
  pjVar16->cumwmsedec = dVar53;
  if (pjVar16 != cblk->passes) {
    pjVar16->cumwmsedec = dVar53 + pjVar16[-1].cumwmsedec;
  }
  local_11c = local_11c - (uint)(lVar18 == 2);
  pjVar16 = pjVar16 + 1;
  bVar52 = (int)uVar13 < 2;
  uVar13 = uVar13 - 1;
  if (bVar52) goto LAB_0012d193;
  goto LAB_0012a35d;
}

Assistant:

int jpc_enc_enccblk(jpc_enc_tcmpt_t *tcmpt, jpc_enc_band_t *band, jpc_enc_cblk_t *cblk)
{
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *endpasses;
	int bitpos;
	int n;
	int adjust;
	int ret;
	int passtype;
	int t;
	jpc_bitstream_t *bout;
	jpc_enc_pass_t *termpass;
	int vcausal;
	int segsym;
	int termmode;
	int c;

	bout = 0;

	cblk->stream = jas_stream_memopen(0, 0);
	assert(cblk->stream);
	cblk->mqenc = jpc_mqenc_create(JPC_NUMCTXS, cblk->stream);
	assert(cblk->mqenc);
	jpc_mqenc_setctxs(cblk->mqenc, JPC_NUMCTXS, jpc_mqctxs);

	cblk->numpasses = (cblk->numbps > 0) ? (3 * cblk->numbps - 2) : 0;
	if (cblk->numpasses > 0) {
		cblk->passes = jas_alloc2(cblk->numpasses, sizeof(jpc_enc_pass_t));
		assert(cblk->passes);
	} else {
		cblk->passes = 0;
	}
	endpasses = (cblk->passes) ? &cblk->passes[cblk->numpasses] : 0;
	for (pass = cblk->passes; pass != endpasses; ++pass) {
		pass->start = 0;
		pass->end = 0;
		pass->term = JPC_ISTERMINATED(pass - cblk->passes, 0, cblk->numpasses, (tcmpt->cblksty & JPC_COX_TERMALL) != 0, (tcmpt->cblksty & JPC_COX_LAZY) != 0);
		pass->type = JPC_SEGTYPE(pass - cblk->passes, 0, (tcmpt->cblksty & JPC_COX_LAZY) != 0);
		pass->lyrno = -1;
if (pass == endpasses - 1) {
assert(pass->term == 1);
	pass->term = 1;
}
	}

	cblk->flags = jas_matrix_create(jas_matrix_numrows(cblk->data) + 2,
	  jas_matrix_numcols(cblk->data) + 2);
	assert(cblk->flags);


	bitpos = cblk->numbps - 1;
	pass = cblk->passes;
	n = cblk->numpasses;
	while (--n >= 0) {

		if (pass->type == JPC_SEG_MQ) {
			/* NOP */
		} else {
			assert(pass->type == JPC_SEG_RAW);
			if (!bout) {
				bout = jpc_bitstream_sopen(cblk->stream, "w");
				if (!bout)
					return -1;
			}
		}

#if 1
		passtype = (pass - cblk->passes + 2) % 3;
#else
		passtype = JPC_PASSTYPE(pass - cblk->passes + 2);
#endif
		pass->start = jas_stream_tell(cblk->stream);
#if 0
assert(jas_stream_tell(cblk->stream) == jas_stream_getrwcount(cblk->stream));
#endif
		assert(bitpos >= 0);
		vcausal = (tcmpt->cblksty & JPC_COX_VSC) != 0;
		segsym = (tcmpt->cblksty & JPC_COX_SEGSYM) != 0;
		if (pass->term) {
			termmode = ((tcmpt->cblksty & JPC_COX_PTERM) ?
			  JPC_MQENC_PTERM : JPC_MQENC_DEFTERM) + 1;
		} else {
			termmode = 0;
		}
		switch (passtype) {
		case JPC_SIGPASS:
			ret = (pass->type == JPC_SEG_MQ) ? jpc_encsigpass(cblk->mqenc,
			  bitpos, band->orient, vcausal, cblk->flags,
			  cblk->data, termmode, &pass->nmsedec) :
			  jpc_encrawsigpass(bout, bitpos, vcausal, cblk->flags,
			  cblk->data, termmode, &pass->nmsedec);
			break;
		case JPC_REFPASS:
			ret = (pass->type == JPC_SEG_MQ) ? jpc_encrefpass(cblk->mqenc,
			  bitpos, cblk->flags, cblk->data, termmode,
			  &pass->nmsedec) : jpc_encrawrefpass(bout, bitpos,
			  cblk->flags, cblk->data, termmode,
			  &pass->nmsedec);
			break;
		case JPC_CLNPASS:
			assert(pass->type == JPC_SEG_MQ);
			ret = jpc_encclnpass(cblk->mqenc, bitpos, band->orient,
			  vcausal, segsym, cblk->flags, cblk->data, termmode,
			  &pass->nmsedec);
			break;
		default:
			assert(0);
			break;
		}

		if (ret) {
			if (bout) {
				jpc_bitstream_close(bout);
			}
			return -1;
		}

		if (pass->type == JPC_SEG_MQ) {
			if (pass->term) {
				jpc_mqenc_init(cblk->mqenc);
			}
			jpc_mqenc_getstate(cblk->mqenc, &pass->mqencstate);
			pass->end = jas_stream_tell(cblk->stream);
			if (tcmpt->cblksty & JPC_COX_RESET) {
				jpc_mqenc_setctxs(cblk->mqenc, JPC_NUMCTXS, jpc_mqctxs);
			}
		} else {
			if (pass->term) {
				if (jpc_bitstream_pending(bout)) {
					jpc_bitstream_outalign(bout, 0x2a);
				}
				jpc_bitstream_close(bout);
				bout = 0;
				pass->end = jas_stream_tell(cblk->stream);
			} else {
				pass->end = jas_stream_tell(cblk->stream) +
				  jpc_bitstream_pending(bout);
/* NOTE - This will not work.  need to adjust by # of pending output bytes */
			}
		}
#if 0
/* XXX - This assertion fails sometimes when various coding modes are used.
This seems to be harmless, but why does it happen at all? */
assert(jas_stream_tell(cblk->stream) == jas_stream_getrwcount(cblk->stream));
#endif

		pass->wmsedec = jpc_fixtodbl(band->rlvl->tcmpt->synweight) *
		  jpc_fixtodbl(band->rlvl->tcmpt->synweight) *
		  jpc_fixtodbl(band->synweight) *
		  jpc_fixtodbl(band->synweight) *
		  jpc_fixtodbl(band->absstepsize) * jpc_fixtodbl(band->absstepsize) *
		  ((double) (1 << bitpos)) * ((double)(1 << bitpos)) *
		  jpc_fixtodbl(pass->nmsedec);
		pass->cumwmsedec = pass->wmsedec;
		if (pass != cblk->passes) {
			pass->cumwmsedec += pass[-1].cumwmsedec;
		}
		if (passtype == JPC_CLNPASS) {
			--bitpos;
		}
		++pass;
	}

#if 0
dump_passes(cblk->passes, cblk->numpasses, cblk);
#endif

	n = 0;
	endpasses = (cblk->passes) ? &cblk->passes[cblk->numpasses] : 0;
	for (pass = cblk->passes; pass != endpasses; ++pass) {
		if (pass->start < n) {
			pass->start = n;
		}
		if (pass->end < n) {
			pass->end = n;
		}
		if (!pass->term) {
			termpass = pass;
			while (termpass - pass < cblk->numpasses &&
			  !termpass->term) {
				++termpass;
			}
			if (pass->type == JPC_SEG_MQ) {
				t = (pass->mqencstate.lastbyte == 0xff) ? 1 : 0;
				if (pass->mqencstate.ctreg >= 5) {
					adjust = 4 + t;
				} else {
					adjust = 5 + t;
				}
				pass->end += adjust;
			}
			if (pass->end > termpass->end) {
				pass->end = termpass->end;
			}
			if ((c = getthebyte(cblk->stream, pass->end - 1)) == EOF) {
				abort();
			}
			if (c == 0xff) {
				++pass->end;
			}
			n = JAS_MAX(n, pass->end);
		} else {
			n = JAS_MAX(n, pass->end);
		}
	}

#if 0
dump_passes(cblk->passes, cblk->numpasses, cblk);
#endif

	if (bout) {
		jpc_bitstream_close(bout);
	}

	return 0;
}